

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::async_request<std::__cxx11::string,std::__cxx11::string>
          (coro_http_client *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uri,http_method method,
          req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *ctx,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *headers,span<char,_18446744073709551615UL> *out_buf)

{
  long lVar1;
  undefined8 uVar2;
  anon_class_8_1_8991fb9c_for__M_tp __d;
  duration duration;
  bool bVar3;
  undefined8 *puVar4;
  reference pvVar5;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  element_type *peVar6;
  undefined8 *extraout_RAX_03;
  undefined4 in_ECX;
  socklen_t __len;
  error_code *this_00;
  byte *pbVar7;
  coro_http_client *this_01;
  undefined8 in_RSI;
  LazyBase<cinatra::resp_data,_false> in_RDI;
  mutable_buffer mVar8;
  error_code eVar9;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000090;
  bool *in_stack_00000098;
  size_t *in_stack_000000a0;
  error_code *in_stack_000000a8;
  coro_http_client *in_stack_000000b0;
  http_method in_stack_00000120;
  bool ok;
  bool no_schema;
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff718;
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *b;
  undefined4 in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff724;
  undefined4 in_stack_fffffffffffff728;
  undefined4 in_stack_fffffffffffff72c;
  undefined4 in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff734;
  coro_http_client *in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff744;
  int local_8b4;
  undefined4 in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff754;
  undefined4 in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff75c;
  undefined4 in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff764;
  string *in_stack_fffffffffffff778;
  coro_http_client *in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  int local_850;
  int local_7cc;
  undefined4 in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff844;
  coro_http_client *in_stack_fffffffffffff848;
  coro_http_client *data;
  int local_784;
  undefined1 in_stack_fffffffffffffa4f;
  undefined4 in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa54;
  undefined8 in_stack_fffffffffffffa58;
  http_method method_00;
  uri_t *in_stack_fffffffffffffa60;
  coro_http_client *in_stack_fffffffffffffa68;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffa80;
  allocator<char> local_471 [33];
  undefined8 local_450;
  mutable_buffer local_438;
  mutable_buffer local_418;
  __sv_type local_338;
  byte local_292;
  byte local_291;
  long local_190;
  undefined4 local_44;
  undefined8 *local_8;
  
  method_00 = (http_method)((ulong)in_stack_fffffffffffffa58 >> 0x20);
  local_8 = &stack0x00000008;
  local_44 = in_ECX;
  puVar4 = (undefined8 *)operator_new(0x438,(nothrow_t *)&std::nothrow);
  if (puVar4 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
    get_return_object_on_allocation_failure();
    return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
  }
  *puVar4 = async_request<std::__cxx11::string,std::__cxx11::string>;
  puVar4[1] = async_request<std::__cxx11::string,std::__cxx11::string>;
  data = (coro_http_client *)(puVar4 + 0x53);
  this_00 = (error_code *)(puVar4 + 0x70);
  b = (req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)(puVar4 + 0x45);
  pbVar7 = (byte *)((long)puVar4 + 0x433);
  puVar4[0x84] = in_RSI;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738);
  *(undefined4 *)(puVar4 + 0x85) = local_44;
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
              in_stack_fffffffffffff718);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                  (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff718);
  puVar4[0x6c] = in_stack_00000008;
  puVar4[0x6d] = in_stack_00000010;
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::LazyPromise
            ((LazyPromise<cinatra::resp_data> *)
             CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::get_return_object
            ((LazyPromise<cinatra::resp_data> *)in_stack_fffffffffffff738);
  async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar4 + 2));
  bVar3 = std::suspend_always::await_ready((suspend_always *)((long)puVar4 + 0x431));
  if (!bVar3) {
    *(undefined1 *)(puVar4 + 0x86) = 0;
    async_request((void *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                  (void *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
  }
  std::suspend_always::await_resume((suspend_always *)((long)puVar4 + 0x431));
  bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3d66cb);
  if (!bVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3d66ea);
  }
  bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3d6705);
  if (!bVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3d6724);
  }
  local_190 = puVar4[0x84];
  uVar2 = puVar4[0x6d];
  *(undefined8 *)(local_190 + 0x1008) = puVar4[0x6c];
  *(undefined8 *)(local_190 + 0x1010) = uVar2;
  __d.this._4_4_ = in_stack_fffffffffffff734;
  __d.this._0_4_ = in_stack_fffffffffffff730;
  std::shared_ptr<int>::
  shared_ptr<cinatra::coro_http_client::async_request<std::__cxx11::string,std::__cxx11::string>(std::__cxx11::string,cinatra::http_method,cinatra::req_context<std::__cxx11::string>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>,std::span<char,18446744073709551615ul>)::_lambda(auto:1)_1_>
            ((shared_ptr<int> *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
             (nullptr_t)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),__d);
  std::error_code::error_code
            ((error_code *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
  *(undefined4 *)(puVar4 + 0x39) = 0;
  *(undefined1 *)((long)puVar4 + 0x1cc) = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(puVar4 + 0x3a));
  std::span<cinatra::http_header,_18446744073709551615UL>::span
            ((span<cinatra::http_header,_18446744073709551615UL> *)0x3d67a2);
  std::error_code::error_code
            ((error_code *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
  puVar4[0x7b] = 0;
  *(undefined1 *)((long)puVar4 + 0x432) = 1;
  uri_t::uri_t((uri_t *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  std::
  __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3d680e);
  bVar3 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  if ((bVar3) ||
     ((bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3d682b),
      !bVar3 && (pvVar5 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720
                                                ),(size_type)in_stack_fffffffffffff718),
                *pvVar5 != '/')))) {
    bVar3 = has_schema<std::__cxx11::string>
                      ((coro_http_client *)
                       CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff738);
    local_291 = (bVar3 ^ 0xffU) & 1;
    if (local_291 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                 (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    }
    local_292 = 0;
    this_01 = data;
    if ((local_291 & 1) != 0) {
      data = in_stack_fffffffffffff848;
      this_01 = (coro_http_client *)(puVar4 + 0x57);
    }
    handle_uri<std::__cxx11::string>
              (this_01,(resp_data *)data,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    std::tie<bool,cinatra::uri_t>
              ((bool *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
               (uri_t *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
    std::tuple<bool&,cinatra::uri_t&>::operator=
              ((tuple<bool_&,_cinatra::uri_t_&> *)
               CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
               (pair<bool,_cinatra::uri_t> *)
               CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    if ((local_292 & 1) == 0) {
      local_7cc = 4;
    }
    else {
      local_7cc = 0;
    }
    if (local_7cc != 0) goto LAB_003d7700;
  }
  else {
    local_338 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
    puVar4[0x15] = local_338._M_len;
    puVar4[0x16] = local_338._M_str;
    this_01 = (coro_http_client *)local_338._M_str;
  }
  __len = (socklen_t)this_01;
  std::
  __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3d6aa4);
  bVar3 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  if (bVar3) {
    connect((coro_http_client *)(puVar4 + 0x7d),(int)puVar4[0x84],(sockaddr *)(puVar4 + 0xd),__len);
    async_simple::coro::detail::LazyPromiseBase::
    await_transform<async_simple::coro::Lazy<cinatra::resp_data>>
              ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
               (Lazy<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
    bVar3 = async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::await_ready
                      ((LazyAwaiterBase<cinatra::resp_data> *)(puVar4 + 0x7c));
    if (!bVar3) {
      *(undefined1 *)(puVar4 + 0x86) = 1;
      async_request((void *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                    in_stack_fffffffffffff738);
      (*(code *)*extraout_RAX)(extraout_RAX);
      return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
    }
    puVar4[0x78] = (LazyAwaiterBase<cinatra::resp_data> *)(puVar4 + 0x7c);
    async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
              ((LazyAwaiterBase<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    memcpy(puVar4 + 0x37,puVar4 + 0x3e,0x38);
    async_simple::coro::detail::LazyBase<cinatra::resp_data,_false>::ValueAwaiter::~ValueAwaiter
              ((ValueAwaiter *)0x3d6c6b);
    async_simple::coro::Lazy<cinatra::resp_data>::~Lazy((Lazy<cinatra::resp_data> *)0x3d6c78);
    if (*(int *)(puVar4 + 0x39) != 0) {
      async_simple::coro::detail::LazyPromise<cinatra::resp_data>::return_value<cinatra::resp_data>
                ((LazyPromise<cinatra::resp_data> *)
                 CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                 (resp_data *)in_stack_fffffffffffff718);
      local_7cc = 3;
      goto LAB_003d7700;
    }
  }
  std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::vector
            ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)0x3d6d18);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                  (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff718);
  build_request_header<cinatra::req_context<std::__cxx11::string>>
            (in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,method_00,
             (req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
             (bool)in_stack_fffffffffffffa4f,in_stack_fffffffffffffa80);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x3d6d8a);
  bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3d6d9b);
  *pbVar7 = (bVar3 ^ 0xffU) & 1;
  in_stack_fffffffffffff718 = b;
  if ((*pbVar7 & 1) != 0) {
    local_418 = (mutable_buffer)
                asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
    asio::const_buffer::const_buffer
              ((const_buffer *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
               (mutable_buffer *)b);
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
               CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),(value_type *)b);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3d6e20);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar4 + 0x21))
    ;
    local_438 = (mutable_buffer)
                asio::buffer((void *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                             (size_t)b);
    asio::const_buffer::const_buffer
              ((const_buffer *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
               (mutable_buffer *)b);
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
               CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),(value_type *)b);
    in_stack_fffffffffffff718 = b;
  }
  lVar1 = puVar4[0x84];
  null_logger_t::operator<<
            ((null_logger_t *)&NULL_LOGGER,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar4 + 0x5b));
  local_450 = *(undefined8 *)(lVar1 + 0xfd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (char *)CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
  duration.__r._4_4_ = in_stack_fffffffffffff794;
  duration.__r._0_4_ = in_stack_fffffffffffff790;
  timer_guard::timer_guard
            ((timer_guard *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
             in_stack_fffffffffffff780,duration,in_stack_fffffffffffff778);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
  std::allocator<char>::~allocator(local_471);
  if ((*pbVar7 & 1) == 0) {
    mVar8 = (mutable_buffer)
            asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
    *(mutable_buffer *)(puVar4 + 0x74) = mVar8;
    async_write<asio::mutable_buffers_1>
              (in_stack_fffffffffffff738,
               (mutable_buffers_1 *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
    async_simple::coro::detail::LazyPromiseBase::
    await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
              ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
               (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
    bVar3 = async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>
            ::await_ready((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                          (puVar4 + 0x80));
    if (!bVar3) {
      *(undefined1 *)(puVar4 + 0x86) = 3;
      async_request((void *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                    in_stack_fffffffffffff738);
      (*(code *)*extraout_RAX_01)(extraout_RAX_01);
      return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
    }
    puVar4[0x77] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)(puVar4 + 0x80);
    async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
    awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::tie<std::error_code,unsigned_long>
              ((error_code *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
               (unsigned_long *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
    std::tuple<std::error_code&,unsigned_long&>::operator=
              ((tuple<std::error_code_&,_unsigned_long_&> *)
               CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
               (pair<std::error_code,_unsigned_long> *)
               CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    local_850 = 0;
    async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
    ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x3d742c);
    async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
              ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x3d7439);
    if (local_850 == 0) goto LAB_003d746a;
  }
  else {
    async_write<std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>&>
              (in_stack_fffffffffffff738,
               (vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
               CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
    async_simple::coro::detail::LazyPromiseBase::
    await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
              ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
               (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
    bVar3 = async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>
            ::await_ready((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                          (puVar4 + 0x7e));
    if (!bVar3) {
      *(undefined1 *)(puVar4 + 0x86) = 2;
      async_request((void *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                    in_stack_fffffffffffff738);
      (*(code *)*extraout_RAX_00)(extraout_RAX_00);
      return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
    }
    puVar4[0x76] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)(puVar4 + 0x7e);
    async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
    awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    std::tie<std::error_code,unsigned_long>
              ((error_code *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
               (unsigned_long *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
    std::tuple<std::error_code&,unsigned_long&>::operator=
              ((tuple<std::error_code_&,_unsigned_long_&> *)
               CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
               (pair<std::error_code,_unsigned_long> *)
               CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
    ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x3d71ef);
    async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
              ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x3d71fc);
LAB_003d746a:
    bVar3 = std::error_code::operator_cast_to_bool(this_00);
    if (bVar3) {
      local_850 = 4;
    }
    else {
      req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                    in_stack_fffffffffffff718);
      in_stack_fffffffffffff718 =
           (req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)CONCAT44((int)((ulong)in_stack_fffffffffffff718 >> 0x20),
                       *(undefined4 *)(puVar4 + 0x85));
      handle_read<std::__cxx11::string>
                (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                 in_stack_00000090,in_stack_00000120);
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<cinatra::resp_data>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),
                 (Lazy<cinatra::resp_data> *)
                 CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
      bVar3 = async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::await_ready
                        ((LazyAwaiterBase<cinatra::resp_data> *)(puVar4 + 0x82));
      if (!bVar3) {
        *(undefined1 *)(puVar4 + 0x86) = 4;
        async_request((void *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                      in_stack_fffffffffffff738);
        (*(code *)*extraout_RAX_02)(extraout_RAX_02);
        return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
      }
      puVar4[0x79] = (LazyAwaiterBase<cinatra::resp_data> *)(puVar4 + 0x82);
      async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
                ((LazyAwaiterBase<cinatra::resp_data> *)
                 CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
      memcpy(puVar4 + 0x37,puVar4 + 0x4c,0x38);
      local_850 = 0;
      async_simple::coro::detail::LazyBase<cinatra::resp_data,_false>::ValueAwaiter::~ValueAwaiter
                ((ValueAwaiter *)0x3d7674);
      async_simple::coro::Lazy<cinatra::resp_data>::~Lazy((Lazy<cinatra::resp_data> *)0x3d7681);
      req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
      if (local_850 == 0) {
        local_850 = 0;
      }
    }
  }
  timer_guard::~timer_guard
            ((timer_guard *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
  std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::~vector
            ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
             CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  local_7cc = local_850;
LAB_003d7700:
  local_8b4 = local_7cc;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
  if ((local_8b4 == 0) || (local_8b4 == 4)) {
    bVar3 = std::error_code::operator_cast_to_bool(this_00);
    if ((bVar3) &&
       (peVar6 = std::
                 __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3d7775), (peVar6->is_timeout_ & 1U) != 0)) {
      eVar9 = std::make_error_code(0);
      *(ulong *)this_00 = CONCAT44(in_stack_fffffffffffffa54,eVar9._M_value);
      puVar4[0x71] = eVar9._M_cat;
    }
    eVar9._M_cat._0_4_ = in_stack_fffffffffffff740;
    eVar9._0_8_ = in_stack_fffffffffffff738;
    eVar9._M_cat._4_4_ = in_stack_fffffffffffff744;
    handle_result((coro_http_client *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                  (resp_data *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728),eVar9,
                  SUB41((uint)in_stack_fffffffffffff724 >> 0x18,0));
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::return_value<cinatra::resp_data>
              ((LazyPromise<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
               (resp_data *)in_stack_fffffffffffff718);
    local_8b4 = 3;
  }
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)0x3d78ba);
  local_784 = local_8b4;
  if (local_8b4 == 3) {
    async_simple::coro::detail::LazyPromiseBase::final_suspend((LazyPromiseBase *)(puVar4 + 2));
    bVar3 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                      ((FinalAwaiter *)((long)puVar4 + 0x434));
    if (!bVar3) {
      *puVar4 = 0;
      *(undefined1 *)(puVar4 + 0x86) = 5;
      async_request((void *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                    (void *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      (*(code *)*extraout_RAX_03)(extraout_RAX_03);
      return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
    }
    async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
              ((FinalAwaiter *)((long)puVar4 + 0x434));
    in_stack_fffffffffffff724 = 0;
    local_784 = 0;
  }
  async_simple::coro::detail::LazyPromise<cinatra::resp_data>::~LazyPromise
            ((LazyPromise<cinatra::resp_data> *)0x3d7a39);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x3d7a46);
  req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~req_context((req_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffff724,local_784));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff724,local_784));
  if (puVar4 != (undefined8 *)0x0) {
    operator_delete(puVar4,0x438);
  }
  return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<resp_data> async_request(
      S uri, http_method method, req_context<String> ctx,
      std::unordered_map<std::string, std::string> headers = {},
      std::span<char> out_buf = {}) {
    if (!resp_chunk_str_.empty()) {
      resp_chunk_str_.clear();
    }
    if (!body_.empty()) {
      body_.clear();
    }

    out_buf_ = out_buf;

    std::shared_ptr<int> guard(nullptr, [this](auto) {
      if (!req_headers_.empty()) {
        req_headers_.clear();
      }
    });

    resp_data data{};

    std::error_code ec{};
    size_t size = 0;
    bool is_keep_alive = true;

    do {
      uri_t u;
      std::string append_uri;

      if (socket_->has_closed_ || (!uri.empty() && uri[0] != '/')) {
        bool no_schema = !has_schema(uri);

        if (no_schema) {
#ifdef CINATRA_ENABLE_SSL
          if (is_ssl_schema_) {
            append_uri.append("https://").append(uri);
          }
          else
#endif
          {
            append_uri.append("http://").append(uri);
          }
        }
        bool ok = false;
        std::tie(ok, u) = handle_uri(data, no_schema ? append_uri : uri);
        if (!ok) {
          break;
        }
      }
      else {
        u.path = uri;
      }
      if (socket_->has_closed_) {
        data = co_await connect(u);
        if (data.status != 0) {
          co_return data;
        }
      }

      std::vector<asio::const_buffer> vec;
      std::string req_head_str =
          build_request_header(u, method, ctx, false, std::move(headers));

      bool has_body = !ctx.content.empty();
      if (has_body) {
        vec.push_back(asio::buffer(req_head_str));
        vec.push_back(asio::buffer(ctx.content.data(), ctx.content.size()));
      }

#ifdef CORO_HTTP_PRINT_REQ_HEAD
      CINATRA_LOG_DEBUG << req_head_str;
#endif
      auto guard = timer_guard(this, req_timeout_duration_, "request timer");
      if (has_body) {
        std::tie(ec, size) = co_await async_write(vec);
      }
      else {
        std::tie(ec, size) = co_await async_write(asio::buffer(req_head_str));
      }
      if (ec) {
        break;
      }
      data =
          co_await handle_read(ec, size, is_keep_alive, std::move(ctx), method);
    } while (0);
    if (ec && socket_->is_timeout_) {
      ec = std::make_error_code(std::errc::timed_out);
    }
    handle_result(data, ec, is_keep_alive);
    co_return data;
  }